

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nsh_cmd_array.cpp
# Opt level: O0

void __thiscall
NshCmdArrayRegister_SuccessOneElement_Test::NshCmdArrayRegister_SuccessOneElement_Test
          (NshCmdArrayRegister_SuccessOneElement_Test *this)

{
  NshCmdArrayRegister_SuccessOneElement_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__NshCmdArrayRegister_SuccessOneElement_Test_001c8118;
  return;
}

Assistant:

TEST(NshCmdArrayRegister, SuccessOneElement)
{
    nsh_cmd_array_t cmds;
    ASSERT_EQ(nsh_cmd_array_init(&cmds), NSH_STATUS_OK);

    auto status = nsh_cmd_array_register(&cmds, cmd_test_name, &cmd_test_handler);

    ASSERT_EQ(status, NSH_STATUS_OK);
    ASSERT_EQ(cmds.count, 1);
    ASSERT_STREQ(cmds.array[0].name, cmd_test_name);
    ASSERT_EQ(cmds.array[0].handler, &cmd_test_handler);
}